

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O2

VerifySignResponseStruct * __thiscall
cfd::js::api::json::VerifySignResponse::ConvertToStruct
          (VerifySignResponseStruct *__return_storage_ptr__,VerifySignResponse *this)

{
  vector<cfd::js::api::FailSignTxInStruct,_std::allocator<cfd::js::api::FailSignTxInStruct>_>
  local_30;
  
  VerifySignResponseStruct::VerifySignResponseStruct(__return_storage_ptr__);
  __return_storage_ptr__->success = this->success_;
  core::JsonObjectVector<cfd::js::api::json::FailSignTxIn,_cfd::js::api::FailSignTxInStruct>::
  ConvertToStruct(&local_30,&this->fail_txins_);
  std::vector<cfd::js::api::FailSignTxInStruct,_std::allocator<cfd::js::api::FailSignTxInStruct>_>::
  _M_move_assign(&__return_storage_ptr__->fail_txins,&local_30);
  std::vector<cfd::js::api::FailSignTxInStruct,_std::allocator<cfd::js::api::FailSignTxInStruct>_>::
  ~vector(&local_30);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

VerifySignResponseStruct VerifySignResponse::ConvertToStruct() const {  // NOLINT
  VerifySignResponseStruct result;
  result.success = success_;
  result.fail_txins = fail_txins_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}